

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O3

void __thiscall netbase_tests::netbase_getgroup::test_method(netbase_getgroup *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  void *pvVar3;
  int iVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<unsigned_char> __l;
  const_string file_00;
  initializer_list<unsigned_char> __l_00;
  const_string file_01;
  initializer_list<unsigned_char> __l_01;
  const_string file_02;
  initializer_list<unsigned_char> __l_02;
  const_string file_03;
  initializer_list<unsigned_char> __l_03;
  const_string file_04;
  initializer_list<unsigned_char> __l_04;
  const_string file_05;
  initializer_list<unsigned_char> __l_05;
  const_string file_06;
  initializer_list<unsigned_char> __l_06;
  const_string file_07;
  initializer_list<unsigned_char> __l_07;
  const_string file_08;
  initializer_list<unsigned_char> __l_08;
  const_string file_09;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> internal_group;
  check_type cVar7;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  lazy_ostream local_140;
  undefined1 *local_130;
  char **local_128;
  allocator_type local_119;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  assertion_result local_100;
  assertion_result local_e8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  uint local_b0;
  undefined2 local_ac;
  NetGroupManager local_a8;
  string local_78;
  direct_or_indirect local_58;
  uint local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._12_4_ = 0;
  local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._12_4_ = 0;
  local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x147;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"127.0.0.1","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = local_b0 & 0xffffff00;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = "netgroupman.GetGroup(ResolveIP(\"127.0.0.1\")) == std::vector<unsigned char>({0})";
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_158 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_160,0x147);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x148;
  file_00.m_begin = (iterator)&local_170;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_180,
             msg_00);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"257.0.0.1","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = local_b0 & 0xffffff00;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_00,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = "netgroupman.GetGroup(ResolveIP(\"257.0.0.1\")) == std::vector<unsigned char>({0})";
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_188 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_190,0x148);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x149;
  file_01.m_begin = (iterator)&local_1a0;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b0,
             msg_01);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"10.0.0.1","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = local_b0 & 0xffffff00;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_01,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = "netgroupman.GetGroup(ResolveIP(\"10.0.0.1\")) == std::vector<unsigned char>({0})";
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1b8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_1c0,0x149);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x14a;
  file_02.m_begin = (iterator)&local_1d0;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e0,
             msg_02);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"169.254.1.1","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = local_b0 & 0xffffff00;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_02,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = "netgroupman.GetGroup(ResolveIP(\"169.254.1.1\")) == std::vector<unsigned char>({0})";
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1e8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_1f0,0x14a);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x14b;
  file_03.m_begin = (iterator)&local_200;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_210,
             msg_03);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = CONCAT13(local_b0._3_1_,0x20101);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_03,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "netgroupman.GetGroup(ResolveIP(\"1.2.3.4\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_218 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_220,0x14b);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x14c;
  file_04.m_begin = (iterator)&local_230;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_240,
             msg_04);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"::FFFF:0:102:304","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = CONCAT13(local_b0._3_1_,0x20101);
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_04,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "netgroupman.GetGroup(ResolveIP(\"::FFFF:0:102:304\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_248 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_250,0x14c);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x14d;
  file_05.m_begin = (iterator)&local_260;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_270,
             msg_05);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"64:FF9B::102:304","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = CONCAT13(local_b0._3_1_,0x20101);
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_05,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "netgroupman.GetGroup(ResolveIP(\"64:FF9B::102:304\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_278 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_280,0x14d);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x14e;
  file_06.m_begin = (iterator)&local_290;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2a0,
             msg_06);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"2002:102:304:9999:9999:9999:9999:9999","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = CONCAT13(local_b0._3_1_,0x20101);
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_06,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "netgroupman.GetGroup(ResolveIP(\"2002:102:304:9999:9999:9999:9999:9999\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2a8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_2b0,0x14e);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x14f;
  file_07.m_begin = (iterator)&local_2c0;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2d0,
             msg_07);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"2001:0:9999:9999:9999:9999:FEFD:FCFB","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = CONCAT13(local_b0._3_1_,0x20101);
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_07,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "netgroupman.GetGroup(ResolveIP(\"2001:0:9999:9999:9999:9999:FEFD:FCFB\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2d8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_2e0,0x14f);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x150;
  file_08.m_begin = (iterator)&local_2f0;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_300,
             msg_08);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"2001:470:abcd:9999:9999:9999:9999:9999","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = 0x4012002;
  local_ac = 0xaf70;
  __l_08._M_len = 6;
  __l_08._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_08,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "netgroupman.GetGroup(ResolveIP(\"2001:470:abcd:9999:9999:9999:9999:9999\")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 4, 112, 175})"
  ;
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_308 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_310,0x150);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x151;
  file_09.m_begin = (iterator)&local_320;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_330,
             msg_09);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"2001:2001:9999:9999:9999:9999:9999:9999","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_a8,
             (CNetAddr *)&local_58.indirect_contents);
  local_b0 = 0x20012002;
  local_ac = CONCAT11(local_ac._1_1_,1);
  __l_09._M_len = 5;
  __l_09._M_array = (iterator)&local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_118,__l_09,&local_119);
  peVar2 = (element_type *)
           CONCAT71(local_100._1_7_,
                    local_100.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value);
  if ((long)local_100.m_message.px - (long)peVar2 ==
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_100.m_message.px == peVar2) {
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(peVar2,local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (long)local_100.m_message.px - (long)peVar2);
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "netgroupman.GetGroup(ResolveIP(\"2001:2001:9999:9999:9999:9999:9999:9999\")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 32, 1})"
  ;
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_338 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_140,1,0,WARN,_cVar7,(size_t)&local_340,0x151);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_100._1_7_,
                            local_100.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_100.m_message.pn.pi_ - (long)pvVar3);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_58.indirect_contents.indirect = (char *)0x746eb0094921206;
  local_58.indirect_contents.capacity._0_2_ = 0xacc4;
  local_58.direct[10] = '\a';
  __l_10._M_len = 0xb;
  __l_10._M_array = (iterator)&local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,__l_10,
             (allocator_type *)&local_78);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x155;
  file_10.m_begin = (iterator)&local_350;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_360,
             msg_10);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"baz.net","");
  CreateInternal((CNetAddr *)&local_58.indirect_contents,&local_78);
  NetGroupManager::GetGroup(&local_118,&local_a8,(CNetAddr *)&local_58.indirect_contents);
  if ((long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_e8.m_message.px -
      (long)CONCAT71(local_e8._1_7_,
                     local_e8.p_predicate_value.super_readonly_property<bool>.
                     super_class_property<bool>.value)) {
    if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (void *)CONCAT71(local_e8._1_7_,
                                    local_e8.p_predicate_value.super_readonly_property<bool>.
                                    super_class_property<bool>.value),
                   (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = "netgroupman.GetGroup(CreateInternal(\"baz.net\")) == internal_group";
  local_148 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_140,1,0,WARN,0xe92bbd,(size_t)&stack0xfffffffffffffc90,0x155);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pvVar3 = (void *)CONCAT71(local_e8._1_7_,
                            local_e8.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_e8.m_message.pn.pi_ - (long)pvVar3);
  }
  if (local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_a8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_getgroup)
{
    NetGroupManager netgroupman{std::vector<bool>()}; // use /16
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("127.0.0.1")) == std::vector<unsigned char>({0})); // Local -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("257.0.0.1")) == std::vector<unsigned char>({0})); // !Valid -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("10.0.0.1")) == std::vector<unsigned char>({0})); // RFC1918 -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("169.254.1.1")) == std::vector<unsigned char>({0})); // RFC3927 -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("1.2.3.4")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // IPv4
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("::FFFF:0:102:304")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC6145
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("64:FF9B::102:304")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC6052
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2002:102:304:9999:9999:9999:9999:9999")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC3964
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2001:0:9999:9999:9999:9999:FEFD:FCFB")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC4380
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2001:470:abcd:9999:9999:9999:9999:9999")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 4, 112, 175})); //he.net
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2001:2001:9999:9999:9999:9999:9999:9999")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 32, 1})); //IPv6

    // baz.net sha256 hash: 12929400eb4607c4ac075f087167e75286b179c693eb059a01774b864e8fe505
    std::vector<unsigned char> internal_group = {NET_INTERNAL, 0x12, 0x92, 0x94, 0x00, 0xeb, 0x46, 0x07, 0xc4, 0xac, 0x07};
    BOOST_CHECK(netgroupman.GetGroup(CreateInternal("baz.net")) == internal_group);
}